

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::analysis::ConstantManager::CreateInstruction
          (ConstantManager *this,uint32_t id,Constant *c,uint32_t type_id)

{
  IRContext *this_00;
  long lVar1;
  long *plVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  undefined4 in_register_0000000c;
  long *plVar3;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  uint32_t in_R8D;
  uint32_t type;
  uint32_t local_b4;
  uint local_b0;
  Op local_ac;
  undefined1 local_a8 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  undefined1 local_70 [32];
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  initializer_list<spvtools::opt::Operand> local_48;
  IRContext *local_38;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,id);
  plVar3 = (long *)CONCAT44(in_register_0000000c,type_id);
  local_b0 = (uint)c;
  if (in_R8D == 0) {
    this_00 = (IRContext *)*puVar4;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    in_R8D = TypeManager::GetId((this_00->type_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>
                                ._M_head_impl,(Type *)plVar3[1]);
  }
  local_b4 = in_R8D;
  lVar1 = (**(code **)(*plVar3 + 0xb0))(plVar3);
  if (lVar1 == 0) {
    lVar1 = (**(code **)(*plVar3 + 0x80))(plVar3);
    if (lVar1 == 0) {
      plVar2 = (long *)(**(code **)(*plVar3 + 0x70))(plVar3);
      if ((plVar2 == (long *)0x0) &&
         (plVar2 = (long *)(**(code **)(*plVar3 + 0x78))(plVar3), plVar2 == (long *)0x0)) {
        lVar1 = (**(code **)(*plVar3 + 0x88))(plVar3);
        if (lVar1 != 0) {
          CreateCompositeInstruction
                    (this,id,(CompositeConstant *)((ulong)c & 0xffffffff),(uint32_t)lVar1);
          return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                  )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                    )this;
        }
        this->ctx_ = (IRContext *)0x0;
        return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                  )this;
      }
      local_38 = (IRContext *)*puVar4;
      local_ac = OpConstant;
      vec = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            (**(code **)(*plVar2 + 0xc0))(plVar2);
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)local_70,vec);
      local_a8._0_4_ = 9;
      local_a8._8_8_ = &PTR__SmallVector_00930a20;
      local_a8._16_8_ = 0;
      local_a8._32_8_ = local_a8 + 0x18;
      local_80._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_70);
      local_48._M_array = (iterator)local_a8;
      local_48._M_len = 1;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)this,&local_38,&local_ac,&local_b4,&local_b0,&local_48);
      local_a8._8_8_ = &PTR__SmallVector_00930a20;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_80._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_80._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      local_80._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_70._0_8_ = &PTR__SmallVector_00930a20;
      if (local_50._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl ==
          (__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )0x0) {
        return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                  )this;
      }
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_50,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_50._M_t.
                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
      return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                )this;
    }
    local_70._0_8_ = *puVar4;
    local_48._M_array =
         (iterator)CONCAT44(local_48._M_array._4_4_,0x2a - (uint)*(byte *)(lVar1 + 0x28));
  }
  else {
    local_70._0_8_ = *puVar4;
    local_48._M_array = (iterator)CONCAT44(local_48._M_array._4_4_,0x2e);
  }
  local_a8._0_8_ = (iterator)0x0;
  local_a8._8_8_ = (_func_int **)0x0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this,(IRContext **)local_70,(Op *)&local_48,&local_b4,&local_b0,
             (initializer_list<spvtools::opt::Operand> *)local_a8);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> ConstantManager::CreateInstruction(
    uint32_t id, const Constant* c, uint32_t type_id) const {
  uint32_t type =
      (type_id == 0) ? context()->get_type_mgr()->GetId(c->type()) : type_id;
  if (c->AsNullConstant()) {
    return MakeUnique<Instruction>(context(), spv::Op::OpConstantNull, type, id,
                                   std::initializer_list<Operand>{});
  } else if (const BoolConstant* bc = c->AsBoolConstant()) {
    return MakeUnique<Instruction>(
        context(),
        bc->value() ? spv::Op::OpConstantTrue : spv::Op::OpConstantFalse, type,
        id, std::initializer_list<Operand>{});
  } else if (const IntConstant* ic = c->AsIntConstant()) {
    return MakeUnique<Instruction>(
        context(), spv::Op::OpConstant, type, id,
        std::initializer_list<Operand>{
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
                    ic->words())});
  } else if (const FloatConstant* fc = c->AsFloatConstant()) {
    return MakeUnique<Instruction>(
        context(), spv::Op::OpConstant, type, id,
        std::initializer_list<Operand>{
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
                    fc->words())});
  } else if (const CompositeConstant* cc = c->AsCompositeConstant()) {
    return CreateCompositeInstruction(id, cc, type_id);
  } else {
    return nullptr;
  }
}